

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O0

string * httplib::detail::decode_url(string *__return_storage_ptr__,string *s)

{
  bool bVar1;
  char *pcVar2;
  int local_44;
  size_t sStack_40;
  int val_1;
  size_t len;
  char buff [4];
  int local_24;
  int local_20;
  int val;
  int i;
  string *s_local;
  string *result;
  
  val._3_1_ = 0;
  _i = s;
  s_local = __return_storage_ptr__;
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  local_20 = 0;
  while (pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)_i), *pcVar2 != '\0') {
    pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)_i);
    if (*pcVar2 == '%') {
      pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)_i);
      if ((*pcVar2 == '\0') ||
         (pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)_i), *pcVar2 != 'u')) {
        local_44 = 0;
        bVar1 = from_hex_to_i(_i,local_20 + 1,2,&local_44);
        if (bVar1) {
          std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(char)local_44);
          local_20 = local_20 + 2;
        }
        else {
          pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)_i);
          std::__cxx11::string::operator+=((string *)__return_storage_ptr__,*pcVar2);
        }
      }
      else {
        local_24 = 0;
        bVar1 = from_hex_to_i(_i,local_20 + 2,4,&local_24);
        if (bVar1) {
          sStack_40 = to_utf8(local_24,(char *)&len);
          if (sStack_40 != 0) {
            std::__cxx11::string::append((char *)__return_storage_ptr__,(ulong)&len);
          }
          local_20 = local_20 + 5;
        }
        else {
          pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)_i);
          std::__cxx11::string::operator+=((string *)__return_storage_ptr__,*pcVar2);
        }
      }
    }
    else {
      pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)_i);
      if (*pcVar2 == '+') {
        std::__cxx11::string::operator+=((string *)__return_storage_ptr__,' ');
      }
      else {
        pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)_i);
        std::__cxx11::string::operator+=((string *)__return_storage_ptr__,*pcVar2);
      }
    }
    local_20 = local_20 + 1;
  }
  return __return_storage_ptr__;
}

Assistant:

inline std::string decode_url(const std::string& s)
{
    std::string result;

    for (int i = 0; s[i]; i++) {
        if (s[i] == '%') {
            if (s[i + 1] && s[i + 1] == 'u') {
                int val = 0;
                if (from_hex_to_i(s, i + 2, 4, val)) {
                    // 4 digits Unicode codes
                    char buff[4];
                    size_t len = to_utf8(val, buff);
                    if (len > 0) {
                        result.append(buff, len);
                    }
                    i += 5; // 'u0000'
                } else {
                    result += s[i];
                }
            } else {
                int val = 0;
                if (from_hex_to_i(s, i + 1, 2, val)) {
                    // 2 digits hex codes
                    result += val;
                    i += 2; // '00'
                } else {
                    result += s[i];
                }
            }
        } else if (s[i] == '+') {
            result += ' ';
        } else {
            result += s[i];
        }
    }

    return result;
}